

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  st_ptls_log_event_t *psVar1;
  _func_void_st_ptls_log_event_t_ptr_ptls_t_ptr_char_ptr_char_ptr_varargs *p_Var2;
  char hexbuf [129];
  char acStack_b8 [144];
  
  psVar1 = tls->ctx->log_event;
  if (psVar1 != (st_ptls_log_event_t *)0x0) {
    p_Var2 = psVar1->cb;
    ptls_hexdump(acStack_b8,secret.base,secret.len);
    (*p_Var2)(psVar1,tls,type,"%s",acStack_b8);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];

    PTLS_PROBE(NEW_SECRET, tls, type, ptls_hexdump(hexbuf, secret.base, secret.len));

    if (tls->ctx->log_event != NULL)
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", ptls_hexdump(hexbuf, secret.base, secret.len));
}